

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pzvec.h
# Opt level: O1

void __thiscall
TPZVec<TPZEqnArray<double>_>::TPZVec
          (TPZVec<TPZEqnArray<double>_> *this,initializer_list<TPZEqnArray<double>_> *list)

{
  undefined8 *puVar1;
  TPZManVector<int,_100> *this_00;
  ulong uVar2;
  size_type sVar3;
  iterator pTVar4;
  undefined1 auVar5 [16];
  long lVar6;
  ulong *puVar7;
  TPZEqnArray<double> *pTVar8;
  ulong uVar9;
  long lVar10;
  
  this->_vptr_TPZVec = (_func_int **)&PTR__TPZVec_019b5e70;
  this->fStore = (TPZEqnArray<double> *)0x0;
  uVar2 = list->_M_len;
  if (uVar2 != 0) {
    auVar5._8_8_ = 0;
    auVar5._0_8_ = uVar2;
    uVar9 = 0xffffffffffffffff;
    if (SUB168(auVar5 * ZEXT816(0x3290),8) == 0) {
      uVar9 = SUB168(auVar5 * ZEXT816(0x3290),0) | 8;
    }
    puVar7 = (ulong *)operator_new__(uVar9);
    *puVar7 = uVar2;
    lVar10 = 0;
    pTVar8 = (TPZEqnArray<double> *)(puVar7 + 1);
    do {
      TPZEqnArray<double>::TPZEqnArray(pTVar8);
      lVar10 = lVar10 + -0x3290;
      pTVar8 = pTVar8 + 1;
    } while (uVar2 * -0x3290 - lVar10 != 0);
    this->fStore = (TPZEqnArray<double> *)(puVar7 + 1);
  }
  sVar3 = list->_M_len;
  if (sVar3 != 0) {
    pTVar4 = list->_M_array;
    pTVar8 = this->fStore;
    lVar10 = 0;
    do {
      puVar1 = (undefined8 *)
               ((long)(pTVar4->fEqStart).super_TPZManVector<int,_100>.fExtAlloc + lVar10 + -0x28);
      this_00 = (TPZManVector<int,_100> *)
                ((long)(pTVar8->fEqStart).super_TPZManVector<int,_100>.fExtAlloc + lVar10 + -0x20);
      *(undefined8 *)(this_00[-1].fExtAlloc + 0x62) = *puVar1;
      TPZManVector<int,_100>::operator=(this_00,(TPZManVector<int,_100> *)(puVar1 + 1));
      TPZManVector<int,_100>::operator=
                ((TPZManVector<int,_100> *)
                 ((long)(pTVar8->fEqNumber).super_TPZManVector<int,_100>.fExtAlloc + lVar10 + -0x20)
                 ,(TPZManVector<int,_100> *)
                  ((long)(pTVar4->fEqNumber).super_TPZManVector<int,_100>.fExtAlloc + lVar10 + -0x20
                  ));
      TPZManVector<double,_1000>::operator=
                ((TPZManVector<double,_1000> *)
                 ((long)(pTVar8->fEqValues).super_TPZManVector<double,_1000>.fExtAlloc +
                 lVar10 + -0x20),
                 (TPZManVector<double,_1000> *)
                 ((long)(pTVar4->fEqValues).super_TPZManVector<double,_1000>.fExtAlloc +
                 lVar10 + -0x20));
      TPZManVector<int,_1000>::operator=
                ((TPZManVector<int,_1000> *)
                 ((long)(pTVar8->fIndex).super_TPZManVector<int,_1000>.fExtAlloc + lVar10 + -0x20),
                 (TPZManVector<int,_1000> *)
                 ((long)(pTVar4->fIndex).super_TPZManVector<int,_1000>.fExtAlloc + lVar10 + -0x20));
      this_00[0x1d].fExtAlloc[0x5c] = *(int *)(puVar1 + 0x651);
      lVar6 = lVar10 + -0x28;
      lVar10 = lVar10 + 0x3290;
    } while ((iterator)((long)pTVar4[1].fEqStart.super_TPZManVector<int,_100>.fExtAlloc + lVar6) !=
             pTVar4 + sVar3);
  }
  this->fNElements = uVar2;
  this->fNAlloc = uVar2;
  return;
}

Assistant:

TPZVec<T>::TPZVec(const std::initializer_list<T>& list) : fStore(nullptr) {
    const auto size = list.size();
	if (size > 0)
		fStore = new T[size];

	auto it = list.begin();
	auto it_end = list.end();
	T* aux = fStore;
	for (; it != it_end; it++, aux++)
		*aux = *it;

	fNElements = size;
    fNAlloc = size;
}